

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  bool bVar1;
  Token *pTVar2;
  AlphaNum *in_RCX;
  double dVar3;
  AlphaNum local_1a8;
  AlphaNum local_178;
  string local_148;
  string_view local_128;
  int local_114;
  AlphaNum local_110;
  AlphaNum local_e0;
  string local_b0;
  string_view local_90;
  undefined1 local_80 [8];
  string text;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  double *pdStack_20;
  bool negative;
  double *value_local;
  ParserImpl *this_local;
  
  local_21 = 0;
  pdStack_20 = value;
  value_local = (double *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-",&local_49);
  bVar1 = TryConsume(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    local_21 = 1;
  }
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    bVar1 = ConsumeUnsignedDecimalAsDouble(this,pdStack_20,0xffffffffffffffff);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_004427c2;
    }
  }
  else {
    bVar1 = LookingAtType(this,TYPE_FLOAT);
    if (bVar1) {
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      dVar3 = io::Tokenizer::ParseFloat(&pTVar2->text);
      *pdStack_20 = dVar3;
      io::Tokenizer::Next(&this->tokenizer_);
    }
    else {
      bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
      if (!bVar1) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_178,"Expected double, got: ");
        pTVar2 = io::Tokenizer::current(&this->tokenizer_);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a8,&pTVar2->text);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_148,(lts_20250127 *)&local_178,&local_1a8,in_RCX);
        local_128 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148);
        ReportError(this,local_128);
        std::__cxx11::string::~string((string *)&local_148);
        this_local._7_1_ = 0;
        goto LAB_004427c2;
      }
      pTVar2 = io::Tokenizer::current(&this->tokenizer_);
      std::__cxx11::string::string((string *)local_80,(string *)&pTVar2->text);
      absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)local_80);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"inf");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"infinity"), bVar1)) {
        dVar3 = std::numeric_limits<double>::infinity();
        *pdStack_20 = dVar3;
        io::Tokenizer::Next(&this->tokenizer_);
LAB_0044268f:
        local_114 = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"nan");
        if (bVar1) {
          dVar3 = std::numeric_limits<double>::quiet_NaN();
          *pdStack_20 = dVar3;
          io::Tokenizer::Next(&this->tokenizer_);
          goto LAB_0044268f;
        }
        absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,"Expected double, got: ");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)&local_e0,&local_110,in_RCX)
        ;
        local_90 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
        ReportError(this,local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        this_local._7_1_ = 0;
        local_114 = 1;
      }
      std::__cxx11::string::~string((string *)local_80);
      if (local_114 != 0) goto LAB_004427c2;
    }
  }
  if ((local_21 & 1) != 0) {
    *pdStack_20 = -*pdStack_20;
  }
  this_local._7_1_ = 1;
LAB_004427c2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError(absl::StrCat("Expected double, got: ", text));
        return false;
      }
    } else {
      ReportError(
          absl::StrCat("Expected double, got: ", tokenizer_.current().text));
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }